

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testchar.c
# Opt level: O0

int testCurrentChar(xmlParserCtxtPtr ctxt,int *len)

{
  xmlChar *pxVar1;
  int iVar2;
  uint uVar3;
  int len2;
  int err;
  int c;
  xmlChar *oldcur;
  int *len_local;
  xmlParserCtxtPtr ctxt_local;
  
  lastError = 0;
  ctxt_local._4_4_ = xmlCurrentChar(ctxt,len);
  ctxt->input->flags = 0;
  iVar2 = lastError;
  pxVar1 = ctxt->input->cur;
  lastError = 0;
  xmlNextChar(ctxt);
  ctxt->input->flags = 0;
  uVar3 = (int)ctxt->input->cur - (int)pxVar1;
  ctxt->input->cur = pxVar1;
  if ((*ctxt->input->cur == '\0') || (iVar2 == lastError)) {
    if ((iVar2 == 0) && (*len != uVar3)) {
      fprintf(_stderr,"xmlCurrentChar and xmlNextChar report different lengths: %d %d\n",
              (ulong)(uint)*len,(ulong)uVar3);
      ctxt_local._4_4_ = -1;
      iVar2 = lastError;
    }
  }
  else {
    fprintf(_stderr,"xmlCurrentChar and xmlNextChar report different errors: %d %d\n",
            (ulong)(uint)iVar2,(ulong)(uint)lastError);
    ctxt_local._4_4_ = -1;
    iVar2 = lastError;
  }
  lastError = iVar2;
  return ctxt_local._4_4_;
}

Assistant:

static int
testCurrentChar(xmlParserCtxtPtr ctxt, int *len) {
    const xmlChar *oldcur;
    int c, err, len2;

    lastError = 0;
    c = xmlCurrentChar(ctxt, len);
    ctxt->input->flags = 0;
    err = lastError;

    oldcur = ctxt->input->cur;
    lastError = 0;
    xmlNextChar(ctxt);
    ctxt->input->flags = 0;
    len2 = ctxt->input->cur - oldcur;
    ctxt->input->cur = oldcur;

    if ((*ctxt->input->cur != 0) && (err != lastError)) {
        fprintf(stderr, "xmlCurrentChar and xmlNextChar report different "
                "errors: %d %d\n", err, lastError);
        return(-1);
    }

    if ((err == 0) && (*len != len2)) {
        fprintf(stderr, "xmlCurrentChar and xmlNextChar report different "
                "lengths: %d %d\n", *len, len2);
        return(-1);
    }

    lastError = err;

    return(c);
}